

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[5],wabt::Type&,char_const(&)[4],wabt::(anonymous_namespace)::SignedType,char_const(&)[2],wabt::(anonymous_namespace)::StackVar,char_const(&)[6],wabt::(anonymous_namespace)::StackVar,char_const(&)[4],int,char_const(&)[4],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,StackVar *t,char (*u) [5],Type *args,char (*args_1) [4],SignedType *args_2,
          char (*args_3) [2],StackVar *args_4,char (*args_5) [6],StackVar *args_6,char (*args_7) [4]
          ,int *args_8,char (*args_9) [4],Newline *args_10)

{
  anon_unknown_0::CWriter::Write((CWriter *)this,t);
  anon_unknown_0::CWriter::WriteData((CWriter *)this," = (",4);
  anon_unknown_0::CWriter::Write((CWriter *)this,*(Type *)u);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,")((",3);
  anon_unknown_0::CWriter::Write((CWriter *)this,(SignedType)*args);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,")",1);
  anon_unknown_0::CWriter::Write((CWriter *)this,(StackVar *)args_1);
  anon_unknown_0::CWriter::WriteData((CWriter *)this," >> (",5);
  anon_unknown_0::CWriter::Write((CWriter *)this,(StackVar *)args_2);
  anon_unknown_0::CWriter::WriteData((CWriter *)this," & ",3);
  anon_unknown_0::CWriter::Writef((CWriter *)this,"%lu",(long)*(int *)args_3);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,"));",3);
  if (*(int *)(this + 0x94) < 2) {
    anon_unknown_0::CWriter::WriteData((CWriter *)this,"\n",1);
    *(int *)(this + 0x94) = *(int *)(this + 0x94) + 1;
  }
  this[0x90] = (CWriter)0x1;
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }